

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O2

bool Diligent::PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo
               (Serializer<(Diligent::SerializerMode)0> *Ser,
               ConstQual<PipelineStateCreateInfo> *CreateInfo,ConstQual<TPRSNames> *PRSNames,
               DynamicLinearAllocator *Allocator)

{
  Uint32 UVar1;
  TEnable<Diligent::PIPELINE_TYPE> TVar2;
  bool bVar3;
  TEnableStr<const_char_*> TVar4;
  ulong uVar5;
  
  TVar2 = Serializer<(Diligent::SerializerMode)0>::Serialize<Diligent::PIPELINE_TYPE>
                    (Ser,&(CreateInfo->PSODesc).PipelineType);
  if (TVar2) {
    bVar3 = Serializer<(Diligent::SerializerMode)0>::operator()
                      (Ser,&CreateInfo->ResourceSignaturesCount,&CreateInfo->Flags);
    if ((((bVar3) &&
         (bVar3 = Serializer<(Diligent::SerializerMode)0>::operator()
                            (Ser,&(CreateInfo->PSODesc).ResourceLayout.DefaultVariableType,
                             &(CreateInfo->PSODesc).ResourceLayout.DefaultVariableMergeStages),
         bVar3)) &&
        (bVar3 = Serializer<(Diligent::SerializerMode)0>::
                 SerializeArray<Diligent::ShaderResourceVariableDesc_const*,unsigned_int,Diligent::PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::PipelineStateCreateInfo&,std::array<char_const*,8ul>&,Diligent::DynamicLinearAllocator*)::_lambda(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::ShaderResourceVariableDesc&)_1_>
                           (Ser,Allocator,&(CreateInfo->PSODesc).ResourceLayout.Variables,
                            &(CreateInfo->PSODesc).ResourceLayout.NumVariables), bVar3)) &&
       (bVar3 = Serializer<(Diligent::SerializerMode)0>::
                SerializeArray<Diligent::ImmutableSamplerDesc_const*,unsigned_int,bool(*)(Diligent::Serializer<(Diligent::SerializerMode)0>&,Diligent::ImmutableSamplerDesc&)>
                          (Ser,Allocator,&(CreateInfo->PSODesc).ResourceLayout.ImmutableSamplers,
                           &(CreateInfo->PSODesc).ResourceLayout.NumImmutableSamplers,
                           SerializeImmutableSampler<(Diligent::SerializerMode)0>), bVar3)) {
      uVar5 = 0xffffffffffffffff;
      do {
        UVar1 = CreateInfo->ResourceSignaturesCount;
        uVar5 = uVar5 + 1;
        bVar3 = UVar1 + (UVar1 == 0) <= uVar5;
        if (bVar3) {
          return bVar3;
        }
        TVar4 = Serializer<(Diligent::SerializerMode)0>::Serialize<char_const*>
                          (Ser,PRSNames->_M_elems);
        PRSNames = (ConstQual<TPRSNames> *)((long)PRSNames + 8);
      } while (TVar4);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool PSOSerializer<Mode>::SerializeCreateInfo(
    Serializer<Mode>&                   Ser,
    ConstQual<PipelineStateCreateInfo>& CreateInfo,
    ConstQual<TPRSNames>&               PRSNames,
    DynamicLinearAllocator*             Allocator)
{
    // Serialize PipelineStateCreateInfo
    // Serialize PipelineStateDesc
    if (!Ser(CreateInfo.PSODesc.PipelineType))
        return false;

    if (!Ser(CreateInfo.ResourceSignaturesCount,
             CreateInfo.Flags))
        return false;
    // skip SRBAllocationGranularity
    // skip ImmediateContextMask
    // skip pPSOCache

    auto& ResourceLayout = CreateInfo.PSODesc.ResourceLayout;
    if (!Ser(ResourceLayout.DefaultVariableType, ResourceLayout.DefaultVariableMergeStages))
        return false;

    if (!Ser.SerializeArray(Allocator, ResourceLayout.Variables, ResourceLayout.NumVariables,
                            [](Serializer<Mode>&                      Ser,
                               ConstQual<ShaderResourceVariableDesc>& VarDesc) //
                            {
                                return Ser(VarDesc.Name,
                                           VarDesc.ShaderStages,
                                           VarDesc.Type,
                                           VarDesc.Flags);
                            }))
        return false;

    if (!Ser.SerializeArray(Allocator, ResourceLayout.ImmutableSamplers, ResourceLayout.NumImmutableSamplers, SerializeImmutableSampler<Mode>))
        return false;

    // Instead of ppResourceSignatures
    for (Uint32 i = 0; i < std::max(CreateInfo.ResourceSignaturesCount, 1u); ++i)
    {
        if (!Ser(PRSNames[i]))
            return false;
    }

    ASSERT_SIZEOF64(ShaderResourceVariableDesc, 16, "Did you add a new member to ShaderResourceVariableDesc? Please add serialization here.");
    ASSERT_SIZEOF64(PipelineStateCreateInfo, 96, "Did you add a new member to PipelineStateCreateInfo? Please add serialization here.");

    return true;
}